

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O0

void __thiscall llvm::Twine::printOneChildRepr(Twine *this,raw_ostream *OS,Child Ptr,NodeKind Kind)

{
  raw_ostream *prVar1;
  NodeKind Kind_local;
  raw_ostream *OS_local;
  Twine *this_local;
  Child Ptr_local;
  
  this_local._0_4_ = Ptr.decUI;
  switch(Kind) {
  case NullKind:
    raw_ostream::operator<<(OS,"null");
    break;
  case EmptyKind:
    raw_ostream::operator<<(OS,"empty");
    break;
  case TwineKind:
    raw_ostream::operator<<(OS,"rope:");
    printRepr(Ptr.twine,OS);
    break;
  case CStringKind:
    prVar1 = raw_ostream::operator<<(OS,"cstring:\"");
    prVar1 = raw_ostream::operator<<(prVar1,Ptr.cString);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case StdStringKind:
    prVar1 = raw_ostream::operator<<(OS,"std::string:\"");
    prVar1 = raw_ostream::operator<<(prVar1,Ptr.twine);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case StringRefKind:
    prVar1 = raw_ostream::operator<<(OS,"stringref:\"");
    prVar1 = raw_ostream::operator<<(prVar1,Ptr.twine);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case SmallStringKind:
    prVar1 = raw_ostream::operator<<(OS,"smallstring:\"");
    prVar1 = raw_ostream::operator<<(prVar1,Ptr.smallString);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case FormatvObjectKind:
    prVar1 = raw_ostream::operator<<(OS,"formatv:\"");
    prVar1 = raw_ostream::operator<<(prVar1,Ptr.formatvObject);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case CharKind:
    prVar1 = raw_ostream::operator<<(OS,"char:\"");
    this_local._0_1_ = Ptr.character;
    prVar1 = raw_ostream::operator<<(prVar1,(char)this_local);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case DecUIKind:
    prVar1 = raw_ostream::operator<<(OS,"decUI:\"");
    prVar1 = raw_ostream::operator<<(prVar1,(uint)this_local);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case DecIKind:
    prVar1 = raw_ostream::operator<<(OS,"decI:\"");
    prVar1 = raw_ostream::operator<<(prVar1,(uint)this_local);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case DecULKind:
    prVar1 = raw_ostream::operator<<(OS,"decUL:\"");
    prVar1 = raw_ostream::operator<<(prVar1,*Ptr.decUL);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case DecLKind:
    prVar1 = raw_ostream::operator<<(OS,"decL:\"");
    prVar1 = raw_ostream::operator<<(prVar1,*Ptr.decL);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case DecULLKind:
    prVar1 = raw_ostream::operator<<(OS,"decULL:\"");
    prVar1 = raw_ostream::operator<<(prVar1,*Ptr.decULL);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case DecLLKind:
    prVar1 = raw_ostream::operator<<(OS,"decLL:\"");
    prVar1 = raw_ostream::operator<<(prVar1,*Ptr.decLL);
    raw_ostream::operator<<(prVar1,"\"");
    break;
  case UHexKind:
    prVar1 = raw_ostream::operator<<(OS,"uhex:\"");
    prVar1 = raw_ostream::operator<<(prVar1,Ptr.twine);
    raw_ostream::operator<<(prVar1,"\"");
  }
  return;
}

Assistant:

void Twine::printOneChildRepr(raw_ostream &OS, Child Ptr,
                              NodeKind Kind) const {
  switch (Kind) {
  case Twine::NullKind:
    OS << "null"; break;
  case Twine::EmptyKind:
    OS << "empty"; break;
  case Twine::TwineKind:
    OS << "rope:";
    Ptr.twine->printRepr(OS);
    break;
  case Twine::CStringKind:
    OS << "cstring:\""
       << Ptr.cString << "\"";
    break;
  case Twine::StdStringKind:
    OS << "std::string:\""
       << Ptr.stdString << "\"";
    break;
  case Twine::StringRefKind:
    OS << "stringref:\""
       << Ptr.stringRef << "\"";
    break;
  case Twine::SmallStringKind:
    OS << "smallstring:\"" << *Ptr.smallString << "\"";
    break;
  case Twine::FormatvObjectKind:
    OS << "formatv:\"" << *Ptr.formatvObject << "\"";
    break;
  case Twine::CharKind:
    OS << "char:\"" << Ptr.character << "\"";
    break;
  case Twine::DecUIKind:
    OS << "decUI:\"" << Ptr.decUI << "\"";
    break;
  case Twine::DecIKind:
    OS << "decI:\"" << Ptr.decI << "\"";
    break;
  case Twine::DecULKind:
    OS << "decUL:\"" << *Ptr.decUL << "\"";
    break;
  case Twine::DecLKind:
    OS << "decL:\"" << *Ptr.decL << "\"";
    break;
  case Twine::DecULLKind:
    OS << "decULL:\"" << *Ptr.decULL << "\"";
    break;
  case Twine::DecLLKind:
    OS << "decLL:\"" << *Ptr.decLL << "\"";
    break;
  case Twine::UHexKind:
    OS << "uhex:\"" << Ptr.uHex << "\"";
    break;
  }
}